

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

NodeIterator __thiscall
Indexing::RetrievalAlgorithms::
__selectPotentiallyUnifiableChildren<Inferences::ALASCA::SuperpositionConf::Lhs>
          (RetrievalAlgorithms *this,IntermediateNode *n,RobSubstitution *subs,uint normInternalBank
          )

{
  int *piVar1;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  VVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  NodeIterator NVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Top TVar7;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  local_30;
  long *local_28;
  _func_int **pp_Var5;
  
  TVar7 = Kernel::RobSubstitution::getSpecialVarTop(subs,n->childVar,normInternalBank);
  if (((undefined1  [12])TVar7._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    UNRECOVERED_JUMPTABLE = (n->super_Node)._vptr_Node[8];
  }
  else {
    iVar3 = (*(n->super_Node)._vptr_Node[10])
                      (n,TVar7._inner._inner._0_8_,(ulong)(TVar7._inner._inner._8_4_ & 0xff),0);
    pp_Var5 = (_func_int **)CONCAT44(extraout_var,iVar3);
    UNRECOVERED_JUMPTABLE = (n->super_Node)._vptr_Node[9];
    if (pp_Var5 != (_func_int **)0x0) {
      (*UNRECOVERED_JUMPTABLE)(&local_30,n);
      VVar2._core = local_30._core;
      if (local_30._core !=
          (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
           *)0x0) {
        (local_30._core)->_refCnt = (local_30._core)->_refCnt + 1;
      }
      Lib::
      concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node**>>
                ((Lib *)&local_28,local_30);
      if (local_28 != (long *)0x0) {
        iVar3 = (int)local_28[1] + 2;
        *(int *)(local_28 + 1) = iVar3;
        if (iVar3 == 0) {
          (**(code **)(*local_28 + 8))(local_28);
          iVar3 = (int)local_28[1];
        }
        iVar3 = iVar3 + -1;
        *(int *)(local_28 + 1) = iVar3;
        if (iVar3 == 0) {
          (**(code **)(*local_28 + 8))(local_28);
          iVar3 = (int)local_28[1];
        }
        *(int *)(local_28 + 1) = iVar3 + -1;
        if (iVar3 + -1 == 0) {
          (**(code **)(*local_28 + 8))(local_28);
        }
      }
      if (VVar2._core !=
          (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
           *)0x0) {
        piVar1 = &(VVar2._core)->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(VVar2._core)->_vptr_IteratorCore[1])(VVar2._core);
        }
      }
      NVar6._core = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                     *)Lib::FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)
                                  (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      if (local_28 == (long *)0x0) {
        (NVar6._core)->_vptr_IteratorCore = (_func_int **)&PTR__ProxyIterator_00b2f528;
        *(undefined1 *)&NVar6._core[1]._vptr_IteratorCore = 1;
        *(undefined1 *)&NVar6._core[1]._refCnt = 0;
        NVar6._core[2]._vptr_IteratorCore = pp_Var5;
        *(undefined8 *)&NVar6._core[2]._refCnt = 0;
        *(IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
          **)this = NVar6._core;
        (NVar6._core)->_refCnt = 1;
      }
      else {
        *(int *)(local_28 + 1) = (int)local_28[1] + 1;
        (NVar6._core)->_refCnt = 0;
        (NVar6._core)->_vptr_IteratorCore = (_func_int **)&PTR__ProxyIterator_00b2f528;
        *(undefined1 *)&NVar6._core[1]._vptr_IteratorCore = 1;
        *(undefined1 *)&NVar6._core[1]._refCnt = 0;
        NVar6._core[2]._vptr_IteratorCore = pp_Var5;
        *(long **)&NVar6._core[2]._refCnt = local_28;
        *(int *)(local_28 + 1) = (int)local_28[1] + 1;
        *(IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
          **)this = NVar6._core;
        (NVar6._core)->_refCnt = (NVar6._core)->_refCnt + 1;
        iVar3 = (int)local_28[1] + -1;
        *(int *)(local_28 + 1) = iVar3;
        if (iVar3 == 0) {
          (**(code **)(*local_28 + 8))(local_28);
          iVar3 = (int)local_28[1];
        }
        uVar4 = iVar3 - 1;
        NVar6._core = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                       *)(ulong)uVar4;
        *(uint *)(local_28 + 1) = uVar4;
        if (uVar4 == 0) {
          NVar6._core = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                         *)(**(code **)(*local_28 + 8))(local_28);
        }
      }
      if (local_30._core !=
          (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
           *)0x0) {
        piVar1 = &(local_30._core)->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          iVar3 = (*(local_30._core)->_vptr_IteratorCore[1])();
          NVar6._core = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                         *)CONCAT44(extraout_var_01,iVar3);
        }
      }
      return (NodeIterator)NVar6._core;
    }
  }
  NVar6._core._0_4_ = (*UNRECOVERED_JUMPTABLE)(this,n);
  NVar6._core._4_4_ = extraout_var_00;
  return (NodeIterator)NVar6._core;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator __selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, RobSubstitution& subs, unsigned normInternalBank)
      {
        unsigned specVar=n->childVar;
        auto top = subs.getSpecialVarTop(specVar, normInternalBank);
        if(top.var()) {
          return n->allChildren();
        } else {
          auto** match = n->childByTop(top, /* canCreate */ false);
          if(match) {
            return pvi(concatIters(
                         getSingletonIterator(match),
                         n->variableChildren()));
          } else {
            return n->variableChildren();
          }
        }
      }